

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O0

int testing::internal::GetNextRandomSeed(int seed)

{
  bool bVar1;
  ostream *poVar2;
  int local_5c;
  bool local_21;
  int next_seed;
  GTestLog local_10;
  int local_c;
  int seed_local;
  
  local_21 = 0 < seed && seed < 100000;
  local_c = seed;
  bVar1 = IsTrue(local_21);
  if (!bVar1) {
    GTestLog::GTestLog(&local_10,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/ribtoks[P]chillout/vendors/gtest/googletest/src/gtest-internal-inl.h"
                       ,0x99);
    poVar2 = GTestLog::GetStream(&local_10);
    poVar2 = std::operator<<(poVar2,"Condition 1 <= seed && seed <= kMaxRandomSeed failed. ");
    poVar2 = std::operator<<(poVar2,"Invalid random seed ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_c);
    poVar2 = std::operator<<(poVar2," - must be in [1, ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,99999);
    std::operator<<(poVar2,"].");
    GTestLog::~GTestLog(&local_10);
  }
  local_5c = local_c + 1;
  if (99999 < local_5c) {
    local_5c = 1;
  }
  return local_5c;
}

Assistant:

inline int GetNextRandomSeed(int seed) {
  GTEST_CHECK_(1 <= seed && seed <= kMaxRandomSeed)
      << "Invalid random seed " << seed << " - must be in [1, "
      << kMaxRandomSeed << "].";
  const int next_seed = seed + 1;
  return (next_seed > kMaxRandomSeed) ? 1 : next_seed;
}